

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_get_attribute_list
          (exr_const_context_t ctxt,int part_index,exr_attr_list_access_mode_t mode,int32_t *count,
          exr_attribute_t **outlist)

{
  long lVar1;
  exr_result_t eVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  void *in_R8;
  exr_const_priv_part_t part;
  exr_attribute_t **srclist;
  exr_const_context_t in_stack_ffffffffffffffd0;
  exr_const_context_t c;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffd0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffd0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RCX == (int *)0x0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_stack_ffffffffffffffd0);
        }
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else {
        if (in_EDX == 1) {
          c = *(exr_const_context_t *)(lVar1 + 0x18);
        }
        else {
          if (in_EDX != 0) {
            if (*in_RDI == '\x01') {
              internal_exr_unlock(in_stack_ffffffffffffffd0);
            }
            eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
            return eVar2;
          }
          c = *(exr_const_context_t *)(lVar1 + 0x10);
        }
        if ((in_R8 != (void *)0x0) && (*(int *)(lVar1 + 8) <= *in_RCX)) {
          memcpy(in_R8,c,(long)*(int *)(lVar1 + 8) << 3);
        }
        *in_RCX = *(int *)(lVar1 + 8);
        if (*in_RDI == '\x01') {
          internal_exr_unlock(c);
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_attribute_list (
    exr_const_context_t         ctxt,
    int                         part_index,
    exr_attr_list_access_mode_t mode,
    int32_t*                    count,
    const exr_attribute_t**     outlist)
{
    exr_attribute_t** srclist;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (!count)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (mode == EXR_ATTR_LIST_SORTED_ORDER)
        srclist = part->attributes.sorted_entries;
    else if (mode == EXR_ATTR_LIST_FILE_ORDER)
        srclist = part->attributes.entries;
    else
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (outlist && *count >= part->attributes.num_attributes)
        memcpy (
            EXR_CONST_CAST (exr_attribute_t**, outlist),
            srclist,
            sizeof (exr_attribute_t*) *
                (size_t) part->attributes.num_attributes);
    *count = part->attributes.num_attributes;
    return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
}